

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O3

void HPDF_Encrypt_CreateOwnerKey(HPDF_Encrypt attr)

{
  ulong uVar1;
  int iVar2;
  HPDF_UINT key_len;
  HPDF_UINT i;
  HPDF_BYTE digest [16];
  HPDF_BYTE new_key [16];
  HPDF_BYTE tmppwd [32];
  HPDF_BYTE tmppwd2 [32];
  HPDF_ARC4_Ctx_Rec rc4_ctx;
  byte local_1f8 [16];
  byte local_1e8 [16];
  HPDF_BYTE local_1d8 [32];
  HPDF_MD5Context local_1b8;
  HPDF_BYTE local_158 [38];
  HPDF_ARC4_Ctx_Rec local_132;
  
  local_1b8.buf[0] = 0x67452301;
  local_1b8.buf[1] = 0xefcdab89;
  local_1b8.buf[2] = 0x98badcfe;
  local_1b8.buf[3] = 0x10325476;
  local_1b8.bits[0] = 0;
  local_1b8.bits[1] = 0;
  HPDF_MD5Update(&local_1b8,attr->owner_passwd,0x20);
  HPDF_MD5Final(local_1f8,&local_1b8);
  if (attr->mode == HPDF_ENCRYPT_R3) {
    iVar2 = 0x32;
    do {
      local_1b8.buf[0] = 0x67452301;
      local_1b8.buf[1] = 0xefcdab89;
      local_1b8.buf[2] = 0x98badcfe;
      local_1b8.buf[3] = 0x10325476;
      local_1b8.bits[0] = 0;
      local_1b8.bits[1] = 0;
      HPDF_MD5Update(&local_1b8,local_1f8,attr->key_len);
      HPDF_MD5Final(local_1f8,&local_1b8);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  key_len = attr->key_len;
  ARC4Init(&local_132,local_1f8,key_len);
  ARC4CryptBuf(&local_132,attr->user_passwd,local_1d8,0x20);
  if (attr->mode == HPDF_ENCRYPT_R3) {
    iVar2 = 1;
    do {
      if (key_len != 0) {
        uVar1 = 0;
        do {
          local_1e8[uVar1] = local_1f8[uVar1] ^ (byte)iVar2;
          uVar1 = uVar1 + 1;
        } while (key_len != uVar1);
      }
      HPDF_MemCpy(local_158,local_1d8,0x20);
      key_len = attr->key_len;
      ARC4Init(&local_132,local_1e8,key_len);
      ARC4CryptBuf(&local_132,local_158,local_1d8,0x20);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x14);
  }
  HPDF_MemCpy(attr->owner_key,local_1d8,0x20);
  return;
}

Assistant:

void
HPDF_Encrypt_CreateOwnerKey  (HPDF_Encrypt  attr)
{
    HPDF_ARC4_Ctx_Rec rc4_ctx;
    HPDF_MD5_CTX md5_ctx;
    HPDF_BYTE digest[HPDF_MD5_KEY_LEN];
    HPDF_BYTE tmppwd[HPDF_PASSWD_LEN];

    HPDF_PTRACE((" HPDF_Encrypt_CreateOwnerKey\n"));

    /* create md5-digest using the value of owner_passwd */

    /* Algorithm 3.3 step 2 */
    HPDF_MD5Init(&md5_ctx);
    HPDF_MD5Update(&md5_ctx, attr->owner_passwd, HPDF_PASSWD_LEN);

    HPDF_PTRACE(("@ Algorithm 3.3 step 2\n"));

    HPDF_MD5Final(digest, &md5_ctx);

    /* Algorithm 3.3 step 3 (Revision 3 only) */
    if (attr->mode == HPDF_ENCRYPT_R3) {
        HPDF_UINT i;

        for (i = 0; i < 50; i++) {
            HPDF_MD5Init(&md5_ctx);

            /* HPDF_MD5Update (&md5_ctx, digest, HPDF_MD5_KEY_LEN); */
            HPDF_MD5Update (&md5_ctx, digest, attr->key_len);
            HPDF_MD5Final(digest, &md5_ctx);

            HPDF_PTRACE(("@ Algorithm 3.3 step 3 loop %u\n", i));
        }
    }

    /* Algorithm 3.3 step 4 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 7 loop 0\n"));

    ARC4Init (&rc4_ctx, digest, attr->key_len);

    HPDF_PTRACE(("@ Algorithm 3.3 step 5\n"));

    /* Algorithm 3.3 step 6 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 6\n"));
    ARC4CryptBuf (&rc4_ctx, attr->user_passwd, tmppwd, HPDF_PASSWD_LEN);

    /* Algorithm 3.3 step 7 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 7\n"));
    if (attr->mode == HPDF_ENCRYPT_R3) {
        HPDF_BYTE tmppwd2[HPDF_PASSWD_LEN];
        HPDF_UINT i;

        for (i = 1; i <= 19; i++) {
            HPDF_UINT j;
            HPDF_BYTE new_key[HPDF_MD5_KEY_LEN];

            for (j = 0; j < attr->key_len; j++)
                new_key[j] = (HPDF_BYTE)(digest[j] ^ i);

            HPDF_PTRACE(("@ Algorithm 3.3 step 7 loop %u\n", i));

            HPDF_MemCpy (tmppwd2, tmppwd, HPDF_PASSWD_LEN);
            ARC4Init(&rc4_ctx, new_key, attr->key_len);
            ARC4CryptBuf(&rc4_ctx, tmppwd2, tmppwd, HPDF_PASSWD_LEN);
        }
    }

    /* Algorithm 3.3 step 8 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 8\n"));
    HPDF_MemCpy (attr->owner_key, tmppwd, HPDF_PASSWD_LEN);
}